

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall OutputStatement::Action(OutputStatement *this)

{
  compile_errcode cVar1;
  allocator local_49;
  string local_48 [8];
  string str;
  SymbolName name;
  SymbolType expression_type;
  int state;
  int ret;
  OutputStatement *this_local;
  
  name = WHILE_SYM;
  do {
    str.field_2._8_4_ = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(name) {
    case WHILE_SYM:
      if (str.field_2._8_4_ != PRINTF_SYM) {
        return -1;
      }
      name = SWITCH_SYM;
      break;
    case SWITCH_SYM:
      if (str.field_2._8_4_ != L_CIRCLE_BRACKET_SYM) {
        return -1;
      }
      name = IF_SYM;
      break;
    case IF_SYM:
      if (str.field_2._8_4_ == STRING_SYM) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,"This is a string",&local_49);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        name = CASE_SYM;
        std::__cxx11::string::~string(local_48);
      }
      else {
        cVar1 = Expression::Action(&this->m_expression,
                                   (SymbolType *)(str.field_2._M_local_buf + 0xc));
        if (cVar1 != 0) {
          return -1;
        }
        name = RETURN_SYM;
      }
      break;
    case CASE_SYM:
      if (str.field_2._8_4_ == COMMA_SYM) {
        name = DEFAULT_SYM;
      }
      else {
        if (str.field_2._8_4_ != R_CIRCLE_BRACKET_SYM) {
          return -1;
        }
        name = PRINTF_SYM;
      }
      break;
    case DEFAULT_SYM:
      cVar1 = Expression::Action(&this->m_expression,(SymbolType *)(str.field_2._M_local_buf + 0xc))
      ;
      if (cVar1 != 0) {
        return -1;
      }
      name = RETURN_SYM;
      break;
    case RETURN_SYM:
      if (str.field_2._8_4_ != R_CIRCLE_BRACKET_SYM) {
        return -1;
      }
      name = PRINTF_SYM;
      break;
    case PRINTF_SYM:
      return 0;
    }
    if (name != RETURN_SYM) {
      SymbolQueue::NextSymbol(handle_correct_queue);
    }
  } while( true );
}

Assistant:

compile_errcode OutputStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == PRINTF_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == STRING_SYM) {
                    string str("This is a string");
                    state = 3;
                    break;
                } else if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == COMMA_SYM) {
                    state = 4;
                    break;
                } else if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 6;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 5: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 6;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 6: return COMPILE_OK;
        }
        if (state != 5)
            handle_correct_queue->NextSymbol();
    }
}